

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

CallExpr mp::internal::ExprBase::Create<mp::CallExpr>(Impl *impl)

{
  BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41> in_RDI;
  CallExpr expr;
  
  CallExpr::CallExpr((CallExpr *)0x147263);
  return (CallExpr)(Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }